

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_websocket_write_job * dequeue_job(cio_websocket *websocket)

{
  cio_websocket_write_job *job;
  cio_websocket *websocket_local;
  
  websocket_local = (cio_websocket *)(websocket->ws_private).first_write_job;
  if (websocket_local == (cio_websocket *)0x0) {
    websocket_local = (cio_websocket *)0x0;
  }
  else if ((websocket->ws_private).first_write_job == (websocket->ws_private).last_write_job) {
    (websocket->ws_private).first_write_job = (cio_websocket_write_job *)0x0;
  }
  else {
    (websocket->ws_private).first_write_job =
         (cio_websocket_write_job *)(websocket_local->ws_private).read_frame_length;
  }
  return (cio_websocket_write_job *)websocket_local;
}

Assistant:

static struct cio_websocket_write_job *dequeue_job(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = websocket->ws_private.first_write_job;
	if (job == NULL) {
		return NULL;
	}

	if (websocket->ws_private.first_write_job == websocket->ws_private.last_write_job) {
		websocket->ws_private.first_write_job = NULL;
	} else {
		websocket->ws_private.first_write_job = job->next;
	}

	return job;
}